

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool __thiscall cs::token_value::dump(token_value *this,ostream *o)

{
  proxy *ppVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined *puVar6;
  char *pcVar7;
  ostream *poVar8;
  MappedConstReference<phmap::priv::FlatHashMapPolicy<char,_char>_> pcVar9;
  var *this_00;
  size_type sVar10;
  iterator iVar11;
  char ch;
  char local_61;
  string local_60;
  pointer local_40;
  size_type local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< Value = ",10);
  ppVar1 = (this->mVal).mDat;
  if (ppVar1 == (proxy *)0x0) {
    puVar6 = &void::typeinfo;
  }
  else {
    iVar4 = (*ppVar1->data->_vptr_baseHolder[2])();
    puVar6 = (undefined *)CONCAT44(extraout_var,iVar4);
  }
  this_00 = &this->mVal;
  pcVar7 = *(char **)(puVar6 + 8);
  if (pcVar7 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
LAB_00126849:
    std::__ostream_insert<char,std::char_traits<char>>(o,"\"",1);
    pbVar5 = cs_impl::any::const_val<std::__cxx11::string>(this_00);
    local_38 = pbVar5->_M_string_length;
    if (local_38 != 0) {
      local_40 = (pbVar5->_M_dataplus)._M_p;
      sVar10 = 0;
      do {
        local_61 = local_40[sVar10];
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)local_61;
        iVar11 = phmap::priv::
                 raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                 ::find<char>((raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                               *)&escape_char,&local_61,
                              SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                              SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0));
        if (iVar11.ctrl_ == (ctrl_t *)(escape_char + DAT_00259728)) {
          local_60._M_dataplus._M_p._0_1_ = local_61;
          poVar8 = o;
        }
        else {
          local_60._M_dataplus._M_p._0_1_ = 0x5c;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>(o,(char *)&local_60,1);
          pcVar9 = phmap::priv::
                   raw_hash_map<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>
                   ::at<char,phmap::priv::FlatHashMapPolicy<char,char>>
                             ((raw_hash_map<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>
                               *)&escape_char,&local_61);
          local_60._M_dataplus._M_p._0_1_ = *pcVar9;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_60,1);
        sVar10 = sVar10 + 1;
      } while (local_38 != sVar10);
    }
    pcVar7 = "\"";
  }
  else {
    if (*pcVar7 != '*') {
      iVar4 = strcmp(pcVar7,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      if (iVar4 == 0) goto LAB_00126849;
    }
    if (this_00->mDat == (proxy *)0x0) {
      puVar6 = &void::typeinfo;
    }
    else {
      iVar4 = (*this_00->mDat->data->_vptr_baseHolder[2])();
      puVar6 = (undefined *)CONCAT44(extraout_var_00,iVar4);
    }
    pcVar7 = *(char **)(puVar6 + 8);
    if (pcVar7 != _ispunct) {
      if (*pcVar7 != '*') {
        iVar4 = strcmp(pcVar7,_ispunct);
        if (iVar4 == 0) goto LAB_001269a1;
      }
      cs_impl::any::to_string_abi_cxx11_(&local_60,this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                (o,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p)
                 ,local_60._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p),
                        local_60.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00126a63;
    }
LAB_001269a1:
    std::__ostream_insert<char,std::char_traits<char>>(o,"\'",1);
    pcVar7 = cs_impl::any::const_val<char>(this_00);
    local_61 = *pcVar7;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)local_61;
    iVar11 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
             ::find<char>((raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                           *)&escape_char,&local_61,
                          SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),8) +
                          SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),0));
    if (iVar11.ctrl_ == (ctrl_t *)(escape_char + DAT_00259728)) {
      local_60._M_dataplus._M_p._0_1_ = local_61;
      poVar8 = o;
    }
    else {
      local_60._M_dataplus._M_p._0_1_ = 0x5c;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(o,(char *)&local_60,1);
      pcVar9 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>
               ::at<char,phmap::priv::FlatHashMapPolicy<char,char>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>
                           *)&escape_char,&local_61);
      local_60._M_dataplus._M_p._0_1_ = *pcVar9;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_60,1);
    pcVar7 = "\'";
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar7,1);
LAB_00126a63:
  std::__ostream_insert<char,std::char_traits<char>>(o,">",1);
  return true;
}

Assistant:

bool token_value::dump(std::ostream &o) const
	{
		o << "< Value = ";
		if (mVal.type() == typeid(cs::string)) {
			o << "\"";
			const cs::string &str = mVal.const_val<cs::string>();
			for (auto ch: str) {
				if (escape_char.count(ch) > 0)
					o << '\\' << escape_char.at(ch);
				else
					o << ch;
			}
			o << "\"";
		}
		else if (mVal.type() == typeid(char)) {
			o << "\'";
			char ch = mVal.const_val<char>();
			if (escape_char.count(ch) > 0)
				o << '\\' << escape_char.at(ch);
			else
				o << ch;
			o << "\'";
		}
		else
			o << mVal.to_string();
		o << ">";
		return true;
	}